

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

int canvas_getconns(t_object *objsrc,int *outno,t_object *objsink,int *inno)

{
  int iVar1;
  _outconnect *lastconnect;
  int iVar2;
  int nout;
  int which;
  t_object *o;
  _outlet *out;
  _inlet *in;
  int local_64;
  t_object *local_60;
  int *local_58;
  int *local_50;
  t_object *local_48;
  _outlet *local_40;
  _inlet *local_38;
  
  iVar2 = 0;
  nout = 0;
  local_60 = objsrc;
  local_58 = outno;
  local_50 = inno;
  while( true ) {
    iVar1 = obj_noutlets(local_60);
    if (iVar1 <= nout) break;
    local_40 = (_outlet *)0x0;
    lastconnect = obj_starttraverseoutlet(local_60,&local_40,nout);
    while (lastconnect != (_outconnect *)0x0) {
      lastconnect = obj_nexttraverseoutlet(lastconnect,&local_48,&local_38,&local_64);
      if (local_48 == objsink) {
        *local_58 = nout;
        *local_50 = local_64;
        iVar2 = iVar2 + 1;
      }
    }
    nout = nout + 1;
  }
  return iVar2;
}

Assistant:

static int canvas_getconns(t_object*objsrc, int *outno, t_object*objsink, int *inno)
{
    int count = 0;
    int n;
    for(n=0; n<obj_noutlets(objsrc); n++)
    {
        t_outlet*out = 0;
        t_outconnect *oc = obj_starttraverseoutlet(objsrc, &out, n);
        while(oc)
        {
            t_object*o;
            t_inlet*in;
            int which;
            oc = obj_nexttraverseoutlet(oc, &o, &in, &which);
            if(o == objsink)
                *outno = n, *inno = which, count++;
        }
    }
    return count;
}